

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O1

uint __thiscall
covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::insert
          (StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *es,bool accept,uint base)

{
  StateCache *this_00;
  pointer *pppSVar1;
  pointer puVar2;
  iterator __position;
  uint *puVar3;
  int iVar4;
  iterator it;
  StateEntry *pSVar5;
  pointer puVar6;
  size_t key_hash;
  node_pointer ppVar7;
  uint *puVar8;
  int iVar9;
  uint uVar10;
  emplace_return eVar11;
  StateEntry *entry;
  StateEntry *local_38;
  
  iVar9 = (int)((ulong)((long)(es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (this->tempsz < iVar9) {
    iVar4 = this->tempsz;
    if (iVar4 < iVar9) {
      do {
        iVar4 = iVar4 * 2;
      } while (iVar4 < iVar9);
      this->tempsz = iVar4;
    }
    pSVar5 = (StateEntry *)realloc(this->temp,(long)(iVar4 * 2) * 4 + 8);
    this->temp = pSVar5;
  }
  puVar6 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar5 = this->temp;
  pSVar5->sz = (int)((ulong)((long)puVar2 - (long)puVar6) >> 2) + 1;
  pSVar5->data[0] = (uint)accept;
  if (puVar2 != puVar6) {
    uVar10 = 1;
    do {
      pSVar5->data[uVar10] = *puVar6;
      puVar6 = puVar6 + 1;
      uVar10 = uVar10 + 1;
    } while (puVar6 != puVar2);
  }
  this_00 = &this->cache;
  key_hash = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*const,_int>_>,_const_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_int,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry>_>
             ::hash(&this_00->table_,&this->temp);
  ppVar7 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>>
           ::
           find_node_impl<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>>
                       *)this_00,key_hash,&this->temp,
                      (EqEntry *)
                      ((this->cache).table_.
                       super_functions<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry>
                       .funcs_ +
                      ((this->cache).table_.
                       super_functions<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::HashEntry,_covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::EqEntry>
                       .current_ & 1)));
  if (ppVar7 == (node_pointer)0x0) {
    local_38 = (StateEntry *)
               malloc(((long)(es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start) * 2 + 8);
    __position._M_current =
         (this->entries).
         super__Vector_base<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->entries).
        super__Vector_base<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry*,std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry*>>
      ::
      _M_realloc_insert<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry*const&>
                ((vector<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry*,std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry*>>
                  *)&this->entries,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      pppSVar1 = &(this->entries).
                  super__Vector_base<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*,_std::allocator<covenant::DFA_impl::StateTable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::StateEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
    puVar8 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (es->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_38->sz = (int)((ulong)((long)puVar3 - (long)puVar8) >> 2) + 1;
    local_38->data[0] = (uint)accept;
    if (puVar3 != puVar8) {
      uVar10 = 1;
      do {
        local_38->data[uVar10] = *puVar8;
        puVar8 = puVar8 + 1;
        uVar10 = uVar10 + 1;
      } while (puVar8 != puVar3);
    }
    eVar11 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>>
             ::
             try_emplace_unique<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const&>
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*const,int>>,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::StateEntry_const*,int,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::HashEntry,covenant::DFA_impl::StateTable<std::vector<unsigned_int,std::allocator<unsigned_int>>>::EqEntry>>
                         *)this_00,&local_38);
    *(uint *)((long)&((eVar11.first.node_.node_)->value_base_).data_.data_ + 8) = base;
  }
  else {
    base = *(uint *)((long)&(ppVar7->value_base_).data_.data_ + 8);
  }
  return base;
}

Assistant:

unsigned int insert(Container & es, bool accept, unsigned int base){
         // Ensure there is enough space in temp for the edges
         if(tempsz < (int) es.size())
         {
           while(tempsz < (int) es.size())
           {
             tempsz *= 2;
           }
           temp = ((StateEntry*) realloc(temp, sizeof(StateEntry) + 
                                         (2*tempsz)*sizeof(unsigned int)));
         }
         // Load the edges into temp.
         temp->sz = es.size() + 1;
         temp->data[0] = accept;
         unsigned int ii=0;
         for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
         {
           temp->data[ii+1] = *it;
           ii++;
         }
         
         // Look for the temporary element in the map.
         typename StateCache::iterator it(cache.find(temp));
         if(it != cache.end())
           return (*it).second;
         // Look for the temporary element in the map.
         if(it != cache.end())
           return (*it).second;
         else 
         {
           StateEntry* entry = ((StateEntry*) malloc(sizeof(StateEntry) + 
                                                     (2*es.size())*sizeof(unsigned int))); 
           entries.push_back(entry);
           entry->sz = es.size() + 1; 
           entry->data[0] = accept;
           unsigned int ii=0;
           for(typename Container::iterator it = es.begin(), et = es.end(); it!=et; ++it)
           {
             entry->data[ii+1] = *it;
             ii++;
           }
           cache[entry] = base;
           return base;
         }
       }